

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_quantity(command *cmd,char *arg,int *amt,wchar_t max)

{
  wchar_t wVar1;
  wchar_t max_local;
  int *amt_local;
  char *arg_local;
  command *cmd_local;
  
  wVar1 = cmd_get_arg_number(cmd,arg,amt);
  if (wVar1 == L'\0') {
    cmd_local._4_4_ = L'\0';
  }
  else {
    wVar1 = get_quantity((char *)0x0,max);
    *amt = wVar1;
    if (*amt < 1) {
      cmd_local._4_4_ = L'\xfffffffd';
    }
    else {
      cmd_set_arg_number(cmd,arg,*amt);
      cmd_local._4_4_ = L'\0';
    }
  }
  return cmd_local._4_4_;
}

Assistant:

int cmd_get_quantity(struct command *cmd, const char *arg, int *amt, int max)
{
	if (cmd_get_arg_number(cmd, arg, amt) == CMD_OK)
		return CMD_OK;

	*amt = get_quantity(NULL, max);
	if (*amt > 0) {
		cmd_set_arg_number(cmd, arg, *amt);
		return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}